

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void encode_mapentry(upb_encstate *e,uint32_t number,upb_MiniTable *layout,upb_MapEntry *ent)

{
  upb_MiniTableField *f;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (layout->field_count_dont_copy_me__upb_internal_use_only != 2) {
    __assert_fail("upb_MiniTable_FieldCount(m) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/mini_table/internal/message.h"
                  ,0x9d,
                  "const struct upb_MiniTableField *upb_MiniTable_MapKey(const struct upb_MiniTable *)"
                 );
  }
  f = layout->fields_dont_copy_me__upb_internal_use_only;
  if (f->number_dont_copy_me__upb_internal_use_only == 1) {
    if (f[1].number_dont_copy_me__upb_internal_use_only == 2) {
      pcVar3 = e->ptr;
      pcVar1 = e->limit;
      encode_scalar(e,&ent->v,layout->subs_dont_copy_me__upb_internal_use_only,f + 1);
      encode_scalar(e,&ent->k,layout->subs_dont_copy_me__upb_internal_use_only,f);
      pcVar2 = e->ptr;
      pcVar3 = pcVar3 + (long)(e->limit + (-(long)pcVar2 - (long)pcVar1));
      if ((pcVar3 < (char *)0x80) && (pcVar2 != e->buf)) {
        e->ptr = pcVar2 + -1;
        pcVar2[-1] = (char)pcVar3;
      }
      else {
        encode_longvarint(e,(uint64_t)pcVar3);
      }
      encode_tag(e,number,'\x02');
      return;
    }
    __assert_fail("upb_MiniTableField_Number(f) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/mini_table/internal/message.h"
                  ,0xa7,
                  "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                 );
  }
  __assert_fail("upb_MiniTableField_Number(f) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/mini_table/internal/message.h"
                ,0x9f,
                "const struct upb_MiniTableField *upb_MiniTable_MapKey(const struct upb_MiniTable *)"
               );
}

Assistant:

static void encode_mapentry(upb_encstate* e, uint32_t number,
                            const upb_MiniTable* layout,
                            const upb_MapEntry* ent) {
  const upb_MiniTableField* key_field = upb_MiniTable_MapKey(layout);
  const upb_MiniTableField* val_field = upb_MiniTable_MapValue(layout);
  size_t pre_len = e->limit - e->ptr;
  size_t size;
  encode_scalar(e, &ent->v, layout->UPB_PRIVATE(subs), val_field);
  encode_scalar(e, &ent->k, layout->UPB_PRIVATE(subs), key_field);
  size = (e->limit - e->ptr) - pre_len;
  encode_varint(e, size);
  encode_tag(e, number, kUpb_WireType_Delimited);
}